

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O0

void uo_cb_stack_push(uo_cb *cb,void *item)

{
  void *item_local;
  uo_cb *cb_local;
  
  uo_stack_push(&cb->stack,item);
  return;
}

Assistant:

inline void uo_cb_stack_push(
    uo_cb *cb,
    void *item)
{
    uo_stack_push(&cb->stack, item);
}